

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_math.cpp
# Opt level: O2

float fast_pow(float x,int y)

{
  float fVar1;
  
  if (y == 0) {
    fVar1 = 1.0;
  }
  else {
    fVar1 = fast_pow(x,y / 2);
    if ((y & 1U) == 0) {
      fVar1 = fVar1 * fVar1;
    }
    else {
      fVar1 = fVar1 * x * fVar1;
    }
  }
  return fVar1;
}

Assistant:

float fast_pow(float x, int y){
    float temp;
    if(y==0) return 1; //base case

    //recursion
    temp = fast_pow(x, y/2);
    if(y%2==0) return temp*temp;
    else return x*temp*temp;
}